

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O0

int __thiscall
wigwag::detail::
listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::connect(listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  lock_primitive *this_00;
  handler_processor *this_01;
  exception_handler *this_02;
  undefined4 in_register_00000034;
  listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *this_03;
  anon_class_16_2_f77679f7 local_60 [2];
  anon_class_8_1_8991fb9c_for__f local_40;
  undefined1 local_38 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_listenable_impl_hpp:215:45)>
  sg;
  handler_attributes attributes_local;
  handler_type *handler_local;
  listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *this_local;
  
  this_03 = (listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
             *)CONCAT44(in_register_00000034,__fd);
  sg._12_4_ = __len;
  this_00 = get_lock_primitive(this_03);
  threading::own_recursive_mutex::lock_primitive::lock_nonrecursive(this_00);
  local_40.this = this_03;
  at_scope_exit<wigwag::detail::listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::connect(std::function<void()>,wigwag::handler_attributes)::_lambda()_1_>
            ((detail *)local_38,&local_40);
  bVar1 = contains_flag<wigwag::handler_attributes>(sg._12_4_,suppress_populator);
  if (!bVar1) {
    this_01 = get_handler_processor(this_03);
    bVar1 = state_populating::populator_only::handler_processor<std::function<void_()>_>::
            has_populate_state(this_01);
    if (bVar1) {
      this_02 = get_exception_handler(this_03);
      local_60[0].this = this_03;
      local_60[0].handler = (handler_type *)__addr;
      exception_handling::none::
      handle_exceptions<wigwag::detail::listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::connect(std::function<void()>,wigwag::handler_attributes)::_lambda()_2_>
                (this_02,local_60);
    }
  }
  listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
  ::create_node<std::function<void()>>
            ((listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
              *)this,__fd,(function<void_()> *)(ulong)(uint)sg._12_4_);
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/include/wigwag/detail/listenable_impl.hpp:215:45)>
  ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_listenable_impl_hpp:215:45)>
                  *)local_38);
  return (int)this;
}

Assistant:

token connect(handler_type handler, handler_attributes attributes)
        {
            get_lock_primitive().lock_nonrecursive();
            auto sg = detail::at_scope_exit([&] { get_lock_primitive().unlock_nonrecursive(); } );

            if (!contains_flag(attributes, handler_attributes::suppress_populator) && get_handler_processor().has_populate_state())
                get_exception_handler().handle_exceptions([&] { get_handler_processor().populate_state(handler); });

            return create_node(attributes, std::move(handler));
        }